

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedWrite::abortRead(BlockedWrite *this)

{
  PromiseFulfiller<void> *pPVar1;
  char (*in_RCX) [29];
  String local_190;
  Exception local_178;
  ArrayPtr<const_char> local_20;
  BlockedWrite *local_10;
  BlockedWrite *this_local;
  
  local_10 = this;
  StringPtr::StringPtr((StringPtr *)&local_20,"abortRead() was called");
  Canceler::cancel(&this->canceler,(StringPtr)local_20);
  pPVar1 = this->fulfiller;
  kj::_::Debug::makeDescription<char_const(&)[29]>
            (&local_190,(Debug *)"\"read end of pipe was aborted\"","read end of pipe was aborted",
             in_RCX);
  Exception::Exception
            (&local_178,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
             ,0x1c5,&local_190);
  (*pPVar1->_vptr_PromiseFulfiller[1])(pPVar1,&local_178);
  Exception::~Exception(&local_178);
  String::~String(&local_190);
  endState(this->pipe,&this->super_AsyncIoStream);
  AsyncPipe::abortRead(this->pipe);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");
      fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
      pipe.endState(*this);
      pipe.abortRead();
    }